

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MemoryMap.hpp
# Opt level: O2

void __thiscall Amiga::MemoryMap::set_overlay(MemoryMap *this,bool enabled)

{
  uint8_t *base;
  
  if (this->overlay_ != enabled) {
    this->overlay_ = enabled;
    base = (this->chip_ram).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
           _M_impl.super__Vector_impl_data._M_start;
    set_region(this,0,*(int *)&(this->chip_ram).
                               super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                               _M_impl.super__Vector_impl_data._M_finish - (int)base,base,0x18);
    if (enabled) {
      set_region(this,0,0x80000,(uint8_t *)this,8);
      return;
    }
  }
  return;
}

Assistant:

void set_overlay(bool enabled) {
			if(overlay_ == enabled) {
				return;
			}
			overlay_ = enabled;

			set_region(0x00'0000, uint32_t(chip_ram.size()), chip_ram.data(), PermitReadWrite);
			if(enabled) {
				set_region(0x00'0000, 0x08'0000, kickstart.data(), PermitRead);
			}
		}